

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O2

bool __thiscall CMU462::Timeline::step(Timeline *this)

{
  int iVar1;
  
  if (this->isPlaying != true) {
    return false;
  }
  iVar1 = this->current_frame;
  if (this->isLooping == true) {
    this->current_frame = (iVar1 + 1) % (this->max_frame + 1);
  }
  else {
    if (this->max_frame <= iVar1) {
      this->current_frame = this->max_frame;
      this->isPlaying = false;
      return false;
    }
    this->current_frame = iVar1 + 1;
  }
  return true;
}

Assistant:

bool Timeline::step() // Update function.
  {

	if(!isPlaying)
	{
	  return false;
	}

	if(isLooping)
	{
	  current_frame = (current_frame + 1) % (max_frame + 1);
	  return true;
	}

	if(current_frame >= max_frame)
	{
	  current_frame = max_frame;
	  isPlaying = false;
	  return false;
	}

	current_frame++;
	return true;
  }